

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O2

void idx2::ForwardCdf53(v3i *Dims3,v3i *M3,int Iter,int NLevels,u64 TformOrder,volume *Vol,
                       bool Normalize)

{
  v3i *pvVar1;
  uint uVar2;
  int iVar3;
  undefined1 *puVar4;
  ulong uVar5;
  uint uVar6;
  grid *Grid;
  int iVar7;
  long lVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  grid G;
  v3i R3;
  v3i D3;
  v3i S3;
  grid_iterator<signed_char> ItEnd;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_Wavelet_cpp:275:5)>
  __ScopeGuard__275;
  grid_iterator<signed_char> It;
  wav_basis_norms_static<16> BasisNorms;
  grid local_250;
  ulong local_238;
  uint local_230;
  ulong local_228;
  uint local_220;
  int local_218;
  ulong local_214;
  uint local_20c;
  grid_iterator<double> local_208;
  v3i *local_1d0;
  ulong local_1c8;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_Wavelet_cpp:275:5)>
  local_1c0;
  grid_iterator<double> local_1b0;
  array<idx2::subband> local_178;
  undefined1 local_140 [136];
  undefined1 local_b8 [136];
  double dVar12;
  
  local_218 = Iter;
  local_220 = (Dims3->field_0).field_0.Z;
  local_228 = *(ulong *)&Dims3->field_0;
  local_230 = (Dims3->field_0).field_0.Z;
  local_238 = *(ulong *)&Dims3->field_0;
  local_214 = 0x100000001;
  local_20c = 1;
  local_250.super_extent.From = 0;
  local_1d0 = Dims3;
  local_250.super_extent.Dims =
       (ulong)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a |
       ((ulong)(uint)(Dims3->field_0).field_0.Y & 0x1fffff) << 0x15 |
       (ulong)(uint)(Dims3->field_0).field_0.X & 0x1fffff;
  local_250.Strd = 0x40000200001;
  iVar7 = 0;
  do {
    local_1c8 = TformOrder;
    while( true ) {
      if (NLevels <= iVar7) {
        if (!Normalize || NLevels < 1) {
          return;
        }
        Mallocator();
        Mallocator();
        pvVar1 = local_1d0;
        local_1c0.Func.Subbands = &local_178;
        local_178.Buffer.Data = (byte *)0x0;
        local_178.Buffer.Bytes = 0;
        local_178.Buffer.Alloc = &Mallocator::Instance.super_allocator;
        local_178.Size = 0;
        local_178.Capacity = 0;
        local_178.Alloc = &Mallocator::Instance.super_allocator;
        local_1c0.Dismissed = false;
        BuildSubbands(local_1d0,NLevels,TformOrder,local_1c0.Func.Subbands);
        GetCdf53NormsFast<16>();
        iVar7 = NLevels * local_218;
        lVar8 = 0;
        goto LAB_0016d109;
      }
      uVar6 = (uint)TformOrder;
      uVar2 = uVar6 & 3;
      TformOrder = TformOrder >> 2;
      if (uVar2 == 3) break;
      switch(Vol->Type) {
      case int8:
        if (uVar2 == 2) {
          FLiftCdf53Z<signed_char>(&local_250,M3,Normal,Vol);
        }
        else if (uVar2 == 1) {
          FLiftCdf53Y<signed_char>(&local_250,M3,Normal,Vol);
        }
        else {
          FLiftCdf53X<signed_char>(&local_250,M3,Normal,Vol);
        }
        break;
      case uint8:
        if (uVar2 == 2) {
          FLiftCdf53Z<unsigned_char>(&local_250,M3,Normal,Vol);
        }
        else if (uVar2 == 1) {
          FLiftCdf53Y<unsigned_char>(&local_250,M3,Normal,Vol);
        }
        else {
          FLiftCdf53X<unsigned_char>(&local_250,M3,Normal,Vol);
        }
        break;
      case int16:
        if (uVar2 == 2) {
          FLiftCdf53Z<short>(&local_250,M3,Normal,Vol);
        }
        else if (uVar2 == 1) {
          FLiftCdf53Y<short>(&local_250,M3,Normal,Vol);
        }
        else {
          FLiftCdf53X<short>(&local_250,M3,Normal,Vol);
        }
        break;
      case uint16:
        if (uVar2 == 2) {
          FLiftCdf53Z<unsigned_short>(&local_250,M3,Normal,Vol);
        }
        else if (uVar2 == 1) {
          FLiftCdf53Y<unsigned_short>(&local_250,M3,Normal,Vol);
        }
        else {
          FLiftCdf53X<unsigned_short>(&local_250,M3,Normal,Vol);
        }
        break;
      case int32:
        if (uVar2 == 2) {
          FLiftCdf53Z<int>(&local_250,M3,Normal,Vol);
        }
        else if (uVar2 == 1) {
          FLiftCdf53Y<int>(&local_250,M3,Normal,Vol);
        }
        else {
          FLiftCdf53X<int>(&local_250,M3,Normal,Vol);
        }
        break;
      case uint32:
        if (uVar2 == 2) {
          FLiftCdf53Z<unsigned_int>(&local_250,M3,Normal,Vol);
        }
        else if (uVar2 == 1) {
          FLiftCdf53Y<unsigned_int>(&local_250,M3,Normal,Vol);
        }
        else {
          FLiftCdf53X<unsigned_int>(&local_250,M3,Normal,Vol);
        }
        break;
      case int64:
        if (uVar2 == 2) {
          FLiftCdf53Z<long>(&local_250,M3,Normal,Vol);
        }
        else if (uVar2 == 1) {
          FLiftCdf53Y<long>(&local_250,M3,Normal,Vol);
        }
        else {
          FLiftCdf53X<long>(&local_250,M3,Normal,Vol);
        }
        break;
      case uint64:
        if (uVar2 == 2) {
          FLiftCdf53Z<unsigned_long>(&local_250,M3,Normal,Vol);
        }
        else if (uVar2 == 1) {
          FLiftCdf53Y<unsigned_long>(&local_250,M3,Normal,Vol);
        }
        else {
          FLiftCdf53X<unsigned_long>(&local_250,M3,Normal,Vol);
        }
        break;
      case float32:
        if (uVar2 == 2) {
          FLiftCdf53Z<float>(&local_250,M3,Normal,Vol);
        }
        else if (uVar2 == 1) {
          FLiftCdf53Y<float>(&local_250,M3,Normal,Vol);
        }
        else {
          FLiftCdf53X<float>(&local_250,M3,Normal,Vol);
        }
        break;
      case float64:
        if (uVar2 == 2) {
          FLiftCdf53Z<double>(&local_250,M3,Normal,Vol);
        }
        else if (uVar2 == 1) {
          FLiftCdf53Y<double>(&local_250,M3,Normal,Vol);
        }
        else {
          FLiftCdf53X<double>(&local_250,M3,Normal,Vol);
        }
      }
      uVar5 = (ulong)((uVar6 & 3) << 2);
      uVar2 = *(uint *)((long)&local_228 + uVar5) | 1;
      *(uint *)((long)&local_238 + uVar5) = uVar2;
      local_250.super_extent.Dims =
           (ulong)(local_230 & 0x1fffff) << 0x2a |
           (local_238 >> 0x20 & 0x1fffff) << 0x15 | local_238 & 0x1fffff;
      *(int *)((long)&local_228 + uVar5) = (int)(uVar2 + 1) >> 1;
      *(int *)((long)&local_214 + uVar5) = *(int *)((long)&local_214 + uVar5) << 1;
    }
    uVar5 = local_1c8;
    if (TformOrder != 3) {
      uVar5 = TformOrder;
    }
    TformOrder = uVar5;
    local_250.Strd =
         (ulong)(local_20c & 0x1fffff) << 0x2a |
         (local_214 >> 0x20 & 0x1fffff) << 0x15 | local_214 & 0x1fffff;
    local_230 = local_220;
    local_250.super_extent.Dims =
         (ulong)(local_220 & 0x1fffff) << 0x2a |
         (local_228 >> 0x20 & 0x1fffff) << 0x15 | local_228 & 0x1fffff;
    local_238 = local_228;
    iVar7 = iVar7 + 1;
  } while( true );
LAB_0016d109:
  dVar12 = 1.0;
  dVar11 = 1.0;
  if (local_178.Size <= lVar8) {
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Wavelet.cpp:275:5)>
    ::~scope_guard(&local_1c0);
    return;
  }
  Grid = (grid *)(local_178.Buffer.Data + lVar8 * 0x40);
  if ((pvVar1->field_0).field_0.X != 1) {
    iVar3 = *(char *)((long)&Grid[2].super_extent.From + 3) + iVar7;
    if (*(char *)((long)&Grid[2].super_extent.From + 6) == '\0') {
      if (0x10 < iVar3) goto LAB_0016d584;
      iVar3 = iVar3 + -1;
      puVar4 = local_140;
    }
    else {
      puVar4 = local_b8;
      if (0xf < iVar3) goto LAB_0016d584;
    }
    dVar11 = *(double *)(puVar4 + (long)iVar3 * 8);
  }
  dVar10 = dVar12;
  if ((pvVar1->field_0).field_0.Y != 1) {
    iVar3 = *(char *)((long)&Grid[2].super_extent.From + 4) + iVar7;
    if (*(char *)((long)&Grid[2].super_extent.From + 7) == '\0') {
      if (0x10 < iVar3) goto LAB_0016d584;
      iVar3 = iVar3 + -1;
      puVar4 = local_140;
    }
    else {
      puVar4 = local_b8;
      if (0xf < iVar3) goto LAB_0016d584;
    }
    dVar10 = *(double *)(puVar4 + (long)iVar3 * 8);
  }
  if ((pvVar1->field_0).field_0.Z != 1) {
    iVar3 = *(char *)((long)&Grid[2].super_extent.From + 5) + iVar7;
    if ((char)Grid[2].super_extent.Dims == '\0') {
      if (0x10 < iVar3) goto LAB_0016d584;
      iVar3 = iVar3 + -1;
      puVar4 = local_140;
    }
    else {
      puVar4 = local_b8;
      if (0xf < iVar3) {
LAB_0016d584:
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                     );
      }
    }
    dVar12 = *(double *)(puVar4 + (long)iVar3 * 8);
  }
  if (Vol->Type < __Invalid__) {
    dVar12 = dVar11 * dVar10 * dVar12;
    switch(Vol->Type) {
    case int8:
      End<signed_char>((grid_iterator<signed_char> *)&local_208,Grid,Vol);
      Begin<signed_char>((grid_iterator<signed_char> *)&local_1b0,Grid,Vol);
      while (local_1b0.Ptr != local_208.Ptr) {
        *(char *)local_1b0.Ptr = (char)(int)((double)(int)*(char *)local_1b0.Ptr * dVar12);
        grid_iterator<signed_char>::operator++((grid_iterator<signed_char> *)&local_1b0);
      }
      break;
    case uint8:
      End<unsigned_char>((grid_iterator<unsigned_char> *)&local_208,Grid,Vol);
      Begin<unsigned_char>((grid_iterator<unsigned_char> *)&local_1b0,Grid,Vol);
      while (local_1b0.Ptr != local_208.Ptr) {
        *(char *)local_1b0.Ptr = (char)(int)((double)*(byte *)local_1b0.Ptr * dVar12);
        grid_iterator<unsigned_char>::operator++((grid_iterator<unsigned_char> *)&local_1b0);
      }
      break;
    case int16:
      End<short>((grid_iterator<short> *)&local_208,Grid,Vol);
      Begin<short>((grid_iterator<short> *)&local_1b0,Grid,Vol);
      while (local_1b0.Ptr != local_208.Ptr) {
        *(short *)local_1b0.Ptr = (short)(int)((double)(int)*(short *)local_1b0.Ptr * dVar12);
        grid_iterator<short>::operator++((grid_iterator<short> *)&local_1b0);
      }
      break;
    case uint16:
      End<unsigned_short>((grid_iterator<unsigned_short> *)&local_208,Grid,Vol);
      Begin<unsigned_short>((grid_iterator<unsigned_short> *)&local_1b0,Grid,Vol);
      while (local_1b0.Ptr != local_208.Ptr) {
        *(short *)local_1b0.Ptr = (short)(int)((double)*(ushort *)local_1b0.Ptr * dVar12);
        grid_iterator<unsigned_short>::operator++((grid_iterator<unsigned_short> *)&local_1b0);
      }
      break;
    case int32:
      End<int>((grid_iterator<int> *)&local_208,Grid,Vol);
      Begin<int>((grid_iterator<int> *)&local_1b0,Grid,Vol);
      while (local_1b0.Ptr != local_208.Ptr) {
        *(int *)local_1b0.Ptr = (int)((double)(int)*(float *)local_1b0.Ptr * dVar12);
        grid_iterator<int>::operator++((grid_iterator<int> *)&local_1b0);
      }
      break;
    case uint32:
      End<unsigned_int>((grid_iterator<unsigned_int> *)&local_208,Grid,Vol);
      Begin<unsigned_int>((grid_iterator<unsigned_int> *)&local_1b0,Grid,Vol);
      while (local_1b0.Ptr != local_208.Ptr) {
        *(float *)local_1b0.Ptr = (float)(long)((double)(uint)*(float *)local_1b0.Ptr * dVar12);
        grid_iterator<unsigned_int>::operator++((grid_iterator<unsigned_int> *)&local_1b0);
      }
      break;
    case int64:
      End<long>((grid_iterator<long> *)&local_208,Grid,Vol);
      Begin<long>((grid_iterator<long> *)&local_1b0,Grid,Vol);
      while (local_1b0.Ptr != local_208.Ptr) {
        *local_1b0.Ptr = (double)(long)((double)(long)*local_1b0.Ptr * dVar12);
        grid_iterator<long>::operator++((grid_iterator<long> *)&local_1b0);
      }
      break;
    case uint64:
      End<unsigned_long>((grid_iterator<unsigned_long> *)&local_208,Grid,Vol);
      Begin<unsigned_long>((grid_iterator<unsigned_long> *)&local_1b0,Grid,Vol);
      while (local_1b0.Ptr != local_208.Ptr) {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *local_1b0.Ptr;
        auVar9 = vunpcklps_avx(auVar9,_DAT_00187bc0);
        auVar9 = vsubpd_avx(auVar9,_DAT_00187bd0);
        dVar11 = (auVar9._0_8_ + auVar9._8_8_) * dVar12;
        uVar5 = (ulong)dVar11;
        *local_1b0.Ptr =
             (double)((long)(dVar11 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5);
        grid_iterator<unsigned_long>::operator++((grid_iterator<unsigned_long> *)&local_1b0);
      }
      break;
    case float32:
      End<float>((grid_iterator<float> *)&local_208,Grid,Vol);
      Begin<float>((grid_iterator<float> *)&local_1b0,Grid,Vol);
      while (local_1b0.Ptr != local_208.Ptr) {
        *(float *)local_1b0.Ptr = (float)((double)*(float *)local_1b0.Ptr * dVar12);
        grid_iterator<float>::operator++((grid_iterator<float> *)&local_1b0);
      }
      break;
    case float64:
      End<double>(&local_208,Grid,Vol);
      Begin<double>(&local_1b0,Grid,Vol);
      while (local_1b0.Ptr != local_208.Ptr) {
        *local_1b0.Ptr = dVar12 * *local_1b0.Ptr;
        grid_iterator<double>::operator++(&local_1b0);
      }
    }
  }
  lVar8 = lVar8 + 1;
  goto LAB_0016d109;
}

Assistant:

void
ForwardCdf53(const v3i& Dims3,
             const v3i& M3,
             int Iter,
             int NLevels,
             u64 TformOrder,
             volume* Vol,
             bool Normalize)
{
  idx2_Assert(Dims3 <= Dims(*Vol));
  int Level = 0;
  u64 PrevOrder = TformOrder;
  v3i D3 = Dims3;
  v3i R3 = D3;
  v3i S3(1);
  grid G(Dims3);
  while (Level < NLevels)
  {
    idx2_Assert(TformOrder != 0);
    int D = TformOrder & 0x3;
    TformOrder >>= 2;
    if (D == 3)
    {                      // next level
      if (TformOrder == 3) // next one is the last |
        TformOrder = PrevOrder;
      else
        PrevOrder = TformOrder;
      SetStrd(&G, S3);
      SetDims(&G, D3);
      R3 = D3;
      ++Level;
    }
    else
    {
#define Body(type)                                                                                 \
  switch (D)                                                                                       \
  {                                                                                                \
    case 0:                                                                                        \
      idx2_Assert(Dims3.X > 1);                                                                    \
      FLiftCdf53X<type>(G, M3, lift_option::Normal, Vol);                                          \
      break;                                                                                       \
    case 1:                                                                                        \
      idx2_Assert(Dims3.Y > 1);                                                                    \
      FLiftCdf53Y<type>(G, M3, lift_option::Normal, Vol);                                          \
      break;                                                                                       \
    case 2:                                                                                        \
      idx2_Assert(Dims3.Z > 1);                                                                    \
      FLiftCdf53Z<type>(G, M3, lift_option::Normal, Vol);                                          \
      break;                                                                                       \
    default:                                                                                       \
      idx2_Assert(false);                                                                          \
      break;                                                                                       \
  };
      idx2_DispatchOnType(Vol->Type);
#undef Body
      R3[D] = D3[D] + IsEven(D3[D]);
      SetDims(&G, R3);
      D3[D] = (R3[D] + 1) >> 1;
      S3[D] <<= 1;
    }
  }

  /* Optionally normalize */
  if (NLevels > 0 && Normalize)
  {
    idx2_Assert(IsFloatingPoint(Vol->Type));
    idx2_RAII(array<subband>, Subbands, BuildSubbands(Dims3, NLevels, TformOrder, &Subbands));
    auto BasisNorms = GetCdf53NormsFast<16>();
    for (int I = 0; I < Size(Subbands); ++I)
    {
      subband& S = Subbands[I];
      f64 Wx = Dims3.X == 1
                 ? 1
                 : (S.LowHigh3.X == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.X - 1]
                                      : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.X]);
      f64 Wy = Dims3.Y == 1
                 ? 1
                 : (S.LowHigh3.Y == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.Y - 1]
                                      : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.Y]);
      f64 Idx2 = Dims3.Z == 1
                   ? 1
                   : (S.LowHigh3.Z == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.Z - 1]
                                        : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.Z]);
      f64 W = Wx * Wy * Idx2;
#define Body(type)                                                                                 \
  auto ItEnd = End<type>(S.Grid, *Vol);                                                            \
  for (auto It = Begin<type>(S.Grid, *Vol); It != ItEnd; ++It)                                     \
    *It = type(*It * W);
      idx2_DispatchOnType(Vol->Type);
#undef Body
    }
  }
}